

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O2

void vkt::sparse::anon_unknown_0::initProgramsDrawWithUBO
               (SourceCollections *programCollection,TestFlags flags)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  ostream *poVar4;
  allocator<char> local_219;
  string local_218;
  undefined1 local_1f8 [40];
  string valueExpr;
  string local_1b0;
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 in_position;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4 gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position = in_position;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valueExpr,"vert",(allocator<char> *)&local_1b0);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&valueExpr);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1f8,&local_218);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f8);
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&valueExpr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  pcVar1 = "ivec4(3*(ndx % nonAliasedSize) ^ 127, 0, 0, 0)";
  if ((flags & 1) == 0) {
    pcVar1 = "ivec4(3*ndx ^ 127, 0, 0, 0)";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valueExpr,pcVar1,(allocator<char> *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(constant_id = 1) const int dataSize  = 1;\n");
  poVar2 = std::operator<<(poVar2,"layout(constant_id = 2) const int chunkSize = 1;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std140) uniform SparseBuffer {\n");
  poVar2 = std::operator<<(poVar2,"    ivec4 data[dataSize];\n");
  poVar2 = std::operator<<(poVar2,"} ubo;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    const int fragNdx        = int(gl_FragCoord.x) + ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
  poVar2 = std::operator<<(poVar2," * int(gl_FragCoord.y);\n");
  poVar2 = std::operator<<(poVar2,"    const int pageSize       = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
  poVar2 = std::operator<<(poVar2," * ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
  poVar2 = std::operator<<(poVar2,";\n");
  std::operator<<(poVar2,"    const int numChunks      = dataSize / chunkSize;\n");
  if ((flags & 1) != 0) {
    std::operator<<((ostream *)&src,
                    "    const int nonAliasedSize = (numChunks > 1 ? dataSize - chunkSize : dataSize);\n"
                   );
  }
  poVar2 = (ostream *)&src;
  poVar4 = std::operator<<(poVar2,"    bool      ok             = true;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    for (int ndx = fragNdx; ndx < dataSize; ndx += pageSize)\n");
  std::operator<<(poVar4,"    {\n");
  if ((~flags & 6) == 0) {
    poVar2 = std::operator<<((ostream *)&src,"        if (ndx >= chunkSize && ndx < 2*chunkSize)\n")
    ;
    poVar2 = std::operator<<(poVar2,"            ok = ok && (ubo.data[ndx] == ivec4(0));\n");
    poVar2 = std::operator<<(poVar2,"        else\n");
    std::operator+(&local_218,"            ok = ok && (ubo.data[ndx] == ",&valueExpr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,");\n");
    std::operator<<(poVar2,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    if ((flags & 2) != 0) {
      poVar2 = std::operator<<((ostream *)&src,
                               "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n");
      poVar2 = std::operator<<(poVar2,"            continue;\n");
    }
    poVar2 = std::operator<<(poVar2,"        ok = ok && (ubo.data[ndx] == ");
    poVar2 = std::operator<<(poVar2,(string *)&valueExpr);
    std::operator<<(poVar2,");\n");
  }
  poVar2 = std::operator<<((ostream *)&src,"    }\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    if (ok)\n");
  poVar2 = std::operator<<(poVar2,"        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"    else\n");
  poVar2 = std::operator<<(poVar2,"        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"frag",&local_219);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_218);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1f8,&local_1b0);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f8);
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&valueExpr);
  return;
}

Assistant:

void initProgramsDrawWithUBO (vk::SourceCollections& programCollection, const TestFlags flags)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const bool			aliased				= (flags & TEST_FLAG_ALIASED) != 0;
		const bool			residency			= (flags & TEST_FLAG_RESIDENCY) != 0;
		const bool			nonResidentStrict	= (flags & TEST_FLAG_NON_RESIDENT_STRICT) != 0;
		const std::string	valueExpr			= (aliased ? "ivec4(3*(ndx % nonAliasedSize) ^ 127, 0, 0, 0)" : "ivec4(3*ndx ^ 127, 0, 0, 0)");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "layout(constant_id = 1) const int dataSize  = 1;\n"
			<< "layout(constant_id = 2) const int chunkSize = 1;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std140) uniform SparseBuffer {\n"
			<< "    ivec4 data[dataSize];\n"
			<< "} ubo;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    const int fragNdx        = int(gl_FragCoord.x) + " << RENDER_SIZE << " * int(gl_FragCoord.y);\n"
			<< "    const int pageSize       = " << RENDER_SIZE << " * " << RENDER_SIZE << ";\n"
			<< "    const int numChunks      = dataSize / chunkSize;\n";

		if (aliased)
			src << "    const int nonAliasedSize = (numChunks > 1 ? dataSize - chunkSize : dataSize);\n";

		src << "    bool      ok             = true;\n"
			<< "\n"
			<< "    for (int ndx = fragNdx; ndx < dataSize; ndx += pageSize)\n"
			<< "    {\n";

		if (residency && nonResidentStrict)
		{
			src << "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n"
				<< "            ok = ok && (ubo.data[ndx] == ivec4(0));\n"
				<< "        else\n"
				<< "            ok = ok && (ubo.data[ndx] == " + valueExpr + ");\n";
		}
		else if (residency)
		{
			src << "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n"
				<< "            continue;\n"
				<< "        ok = ok && (ubo.data[ndx] == " << valueExpr << ");\n";
		}
		else
			src << "        ok = ok && (ubo.data[ndx] == " << valueExpr << ");\n";

		src << "    }\n"
			<< "\n"
			<< "    if (ok)\n"
			<< "        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			<< "    else\n"
			<< "        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}